

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O1

void set_up_anim(Am_Object *line,int val)

{
  Am_Slot_Key AVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  char *pcVar8;
  char *pcVar9;
  ushort uVar10;
  Am_Object anim;
  Am_String s;
  Am_Object local_30;
  Am_Object local_28;
  Am_String local_20;
  
  Am_Object::Get_Object((ushort)&local_30,(ulong)line);
  cVar2 = Am_Object::Valid();
  if (cVar2 != '\0') {
    uVar10 = (ushort)line;
    pAVar6 = (Am_Value *)Am_Object::Get(uVar10,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar6);
    Am_Object::~Am_Object(&local_30);
    if (!bVar3) {
      return;
    }
    Am_Object::Create((char *)&local_30);
    local_20.data = (Am_String_Data *)0x0;
    pcVar8 = "?";
    if (val == 1) {
      pcVar8 = "1";
    }
    pcVar9 = "0";
    if (val != 0) {
      pcVar9 = pcVar8;
    }
    Am_String::operator=(&local_20,pcVar9);
    pAVar6 = (Am_Value *)Am_Object::Get(uVar10,0x8b);
    uVar4 = Am_Value::operator_cast_to_int(pAVar6);
    Am_Object::Set((ushort)&local_30,100,(ulong)uVar4);
    pAVar6 = (Am_Value *)Am_Object::Get(uVar10,0x8c);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    Am_Object::Set((ushort)&local_30,0x65,(ulong)(iVar5 - 10));
    Am_Object::Set((ushort)&local_30,(Am_String *)0xab,(ulong)&local_20);
    AVar1 = INPUT_1;
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(line);
    Am_Object::Add((ushort)&local_30,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar7);
    Am_Object::Am_Object(&local_28,&local_30);
    Am_Object::Add_Part((Am_Object)0x111460,SUB81(&local_28,0),1);
    Am_Object::~Am_Object(&local_28);
    pAVar6 = (Am_Value *)Am_Object::Get(uVar10,0x8d);
    uVar4 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = (Am_Value *)Am_Object::Get(uVar10,0x8e);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    Am_Object::Set((ushort)&local_30,100,(ulong)uVar4);
    Am_Object::Set((ushort)&local_30,0x65,(ulong)(iVar5 - 10));
    Am_String::~Am_String(&local_20);
  }
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

void set_up_anim(Am_Object &line, int val) {
  if (!line.Get_Owner().Valid() || !(bool)line.Get(Am_VISIBLE)) return;
  Am_Object anim = animation_proto.Create();
  Am_String s;
  if (val == 0) s = "0";
  else if (val == 1) s = "1";
  else s = "?";
  anim.Set(Am_LEFT, (int)line.Get(Am_X1), Am_NO_ANIMATION);
  anim.Set(Am_TOP, (int)line.Get(Am_Y1)-10, Am_NO_ANIMATION);
  anim.Set(Am_TEXT, s);
  anim.Add(INPUT_1, line);
  scroller.Add_Part(anim); //add to scroller so not selectable

  int new_left = (int)line.Get(Am_X2);
  int new_top = (int)line.Get(Am_Y2)-10;
  anim.Set(Am_LEFT, new_left);
  anim.Set(Am_TOP, new_top);
}